

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O2

void __thiscall
absl::lts_20250127::AbslStringify<absl::lts_20250127::strings_internal::StringifySink>
          (lts_20250127 *this,StringifySink *sink,Hex hex)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 auVar6 [16];
  string_view v;
  char buffer [32];
  char local_28 [4];
  undefined4 auStack_24 [3];
  
  sVar2 = numbers_internal::FastHexToBufferZeroPad16((uint64_t)sink,local_28);
  uVar3 = hex.value & 0xff;
  if (sVar2 < uVar3) {
    uVar4 = hex.value._1_4_ & 0xffffff;
    uVar8 = (undefined1)(uVar4 >> 0x10);
    uVar7 = (undefined1)(uVar4 >> 8);
    auVar6 = ZEXT616(CONCAT42(CONCAT31(CONCAT21((short)(CONCAT15(uVar8,CONCAT14(uVar8,hex.value.
                                                                                      _1_4_)) >>
                                                       0x20),uVar7),uVar7),
                              CONCAT11((char)uVar4,(char)uVar4)));
    auVar6 = pshuflw(auVar6,auVar6,0);
    uVar5 = auVar6._0_4_;
    lVar1 = -sVar2;
    *(undefined4 *)(local_28 + lVar1) = uVar5;
    *(undefined4 *)((long)auStack_24 + lVar1) = uVar5;
    *(undefined4 *)((long)auStack_24 + lVar1 + 4) = uVar5;
    *(undefined4 *)((long)auStack_24 + lVar1 + 8) = uVar5;
    sVar2 = uVar3;
  }
  v._M_str = &stack0xffffffffffffffe8 + -sVar2;
  v._M_len = sVar2;
  strings_internal::StringifySink::Append((StringifySink *)this,v);
  return;
}

Assistant:

void AbslStringify(S& sink, Hex hex) {
    static_assert(
        numbers_internal::kFastToBufferSize >= 32,
        "This function only works when output buffer >= 32 bytes long");
    char buffer[numbers_internal::kFastToBufferSize];
    char* const end = &buffer[numbers_internal::kFastToBufferSize];
    auto real_width =
        absl::numbers_internal::FastHexToBufferZeroPad16(hex.value, end - 16);
    if (real_width >= hex.width) {
      sink.Append(absl::string_view(end - real_width, real_width));
    } else {
      // Pad first 16 chars because FastHexToBufferZeroPad16 pads only to 16 and
      // max pad width can be up to 20.
      std::memset(end - 32, hex.fill, 16);
      // Patch up everything else up to the real_width.
      std::memset(end - real_width - 16, hex.fill, 16);
      sink.Append(absl::string_view(end - hex.width, hex.width));
    }
  }